

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ProceduralCheckerStatement::fromSyntax
          (Compilation *comp,CheckerInstanceStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  SourceLocation SVar4;
  reference ppSVar5;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDI;
  iterator iVar6;
  InstanceArraySymbol *array;
  Symbol *nestedSym;
  Symbol *sym;
  InstanceNameSyntax *decl;
  HierarchicalInstanceSyntax *instSyntax;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> instances;
  ProceduralBlockSymbol *proc;
  ASTContext *in_stack_fffffffffffffe28;
  Compilation *in_stack_fffffffffffffe30;
  Token *in_stack_fffffffffffffe40;
  ASTContext *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  SourceLocation in_stack_fffffffffffffe58;
  Symbol *in_stack_fffffffffffffe60;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  Symbol *local_108;
  SmallVectorBase<const_slang::ast::Symbol_*> local_a0 [2];
  SourceRange local_60;
  undefined4 local_50;
  bitmask<slang::ast::StatementFlags> local_4c;
  SourceRange local_48;
  undefined4 local_34;
  ProceduralBlockSymbol *local_30;
  EVP_PKEY_CTX *local_10;
  ProceduralCheckerStatement *local_8;
  SourceRange *args_1;
  
  local_10 = in_RDI;
  local_30 = ASTContext::getProceduralBlock(in_stack_fffffffffffffe28);
  if ((local_30 == (ProceduralBlockSymbol *)0x0) || (local_30->procedureKind == Final)) {
    local_34 = 0xa0008;
    local_48 = slang::syntax::SyntaxNode::sourceRange(&in_stack_fffffffffffffe80->super_SyntaxNode);
    sourceRange.endLoc = in_stack_fffffffffffffe58;
    sourceRange.startLoc = in_stack_fffffffffffffe50;
    ASTContext::addDiag(in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                        sourceRange);
    local_8 = (ProceduralCheckerStatement *)
              Statement::badStmt(in_stack_fffffffffffffe30,(Statement *)in_stack_fffffffffffffe28);
  }
  else {
    bitmask<slang::ast::StatementFlags>::bitmask(&local_4c,InForkJoin);
    bVar1 = bitmask<slang::ast::StatementFlags>::has
                      ((bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffe30,
                       (bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffe28);
    if (bVar1) {
      local_50 = 0x90008;
      local_60 = slang::syntax::SyntaxNode::sourceRange
                           (&in_stack_fffffffffffffe80->super_SyntaxNode);
      sourceRange_00.endLoc = in_stack_fffffffffffffe58;
      sourceRange_00.startLoc = in_stack_fffffffffffffe50;
      ASTContext::addDiag(in_stack_fffffffffffffe48,
                          SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),sourceRange_00);
      local_8 = (ProceduralCheckerStatement *)
                Statement::badStmt(in_stack_fffffffffffffe30,(Statement *)in_stack_fffffffffffffe28)
      ;
    }
    else {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x88436b);
      not_null<slang::syntax::CheckerInstantiationSyntax_*>::operator->
                ((not_null<slang::syntax::CheckerInstantiationSyntax_*> *)0x88437c);
      slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
                ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x8843a7);
      iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
                         in_stack_fffffffffffffe30);
      while (uVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
                               ((self_type *)in_stack_fffffffffffffe30,
                                (iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)
                                in_stack_fffffffffffffe28), ((uVar2 ^ 0xff) & 1) != 0) {
        in_stack_fffffffffffffe80 =
             iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                          *)0x88443d);
        if (in_stack_fffffffffffffe80->decl != (InstanceNameSyntax *)0x0) {
          not_null<const_slang::ast::Scope_*>::operator->
                    ((not_null<const_slang::ast::Scope_*> *)0x884481);
          parsing::Token::valueText(in_stack_fffffffffffffe40);
          name._M_str = (char *)iVar6.list;
          name._M_len = iVar6.index;
          in_stack_fffffffffffffe60 =
               Scope::find((Scope *)CONCAT17(uVar2,in_stack_fffffffffffffe88),name);
          local_108 = in_stack_fffffffffffffe60;
          if (in_stack_fffffffffffffe60 != (Symbol *)0x0) {
            while (local_108->kind == InstanceArray) {
              SVar4 = (SourceLocation)
                      Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x88452a);
              in_stack_fffffffffffffe58 = SVar4;
              bVar1 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::empty
                                ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                                 0x88454f);
              if (bVar1) break;
              ppSVar5 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
                        operator[]((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                                   ((long)SVar4 + 0x78),0);
              local_108 = *ppSVar5;
            }
            if (local_108->kind == CheckerInstance) {
              SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                        ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffe30,
                         (Symbol **)in_stack_fffffffffffffe28);
            }
          }
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                    *)in_stack_fffffffffffffe30);
      }
      iVar3 = SmallVectorBase<const_slang::ast::Symbol_*>::copy(local_a0,local_10,src);
      args_1 = (SourceRange *)CONCAT44(extraout_var,iVar3);
      slang::syntax::SyntaxNode::sourceRange(&in_stack_fffffffffffffe80->super_SyntaxNode);
      local_8 = BumpAllocator::
                emplace<slang::ast::ProceduralCheckerStatement,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::SourceRange>
                          ((BumpAllocator *)in_stack_fffffffffffffe60,
                           (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)
                           in_stack_fffffffffffffe58,args_1);
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x88468e);
    }
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ProceduralCheckerStatement::fromSyntax(Compilation& comp,
                                                  const CheckerInstanceStatementSyntax& syntax,
                                                  const ASTContext& context,
                                                  StatementContext& stmtCtx) {
    auto proc = context.getProceduralBlock();
    if (!proc || proc->procedureKind == ProceduralBlockKind::Final) {
        context.addDiag(diag::CheckerNotInProc, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::CheckerInForkJoin, syntax.sourceRange());
        return badStmt(comp, nullptr);
    }

    // Find all of the checkers that were pre-created for this syntax node.
    // It's possible to not find them if there were errors in the declaration,
    // so we don't issue errors here -- they are already handled.
    SmallVector<const Symbol*> instances;
    for (auto instSyntax : syntax.instance->instances) {
        if (auto decl = instSyntax->decl) {
            if (auto sym = context.scope->find(decl->name.valueText())) {
                auto nestedSym = sym;
                while (nestedSym->kind == SymbolKind::InstanceArray) {
                    auto& array = nestedSym->as<InstanceArraySymbol>();
                    if (array.elements.empty())
                        break;

                    nestedSym = array.elements[0];
                }

                if (nestedSym->kind == SymbolKind::CheckerInstance)
                    instances.push_back(sym);
            }
        }
    }

    return *comp.emplace<ProceduralCheckerStatement>(instances.copy(comp), syntax.sourceRange());
}